

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O2

void __thiscall google::protobuf::DynamicMessage::~DynamicMessage(DynamicMessage *this)

{
  int iVar1;
  Descriptor *pDVar2;
  long lVar3;
  string *this_00;
  DynamicMessage *pDVar4;
  int *piVar5;
  long lVar6;
  RepeatedField<double> *this_01;
  int i;
  long i_00;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DynamicMessage_00298b50;
  pDVar2 = this->type_info_->type;
  UnknownFieldSet::~UnknownFieldSet
            ((UnknownFieldSet *)
             ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
             (long)this->type_info_->unknown_fields_offset));
  lVar6 = (long)this->type_info_->extensions_offset;
  if (lVar6 != -1) {
    internal::ExtensionSet::~ExtensionSet
              ((ExtensionSet *)
               ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite + lVar6));
  }
  lVar6 = 0x2c;
  for (i_00 = 0; i_00 < *(int *)(pDVar2 + 0x2c); i_00 = i_00 + 1) {
    lVar3 = *(long *)(pDVar2 + 0x30);
    piVar5 = internal::scoped_array<int>::operator[](&this->type_info_->offsets,i_00);
    this_01 = (RepeatedField<double> *)
              ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite + (long)*piVar5);
    iVar1 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar3 + lVar6) * 4);
    if (*(int *)(lVar3 + 4 + lVar6) == 3) {
      switch(iVar1) {
      case 1:
      case 8:
        RepeatedField<int>::~RepeatedField((RepeatedField<int> *)this_01);
        break;
      case 2:
        RepeatedField<long>::~RepeatedField((RepeatedField<long> *)this_01);
        break;
      case 3:
        RepeatedField<unsigned_int>::~RepeatedField((RepeatedField<unsigned_int> *)this_01);
        break;
      case 4:
        RepeatedField<unsigned_long>::~RepeatedField((RepeatedField<unsigned_long> *)this_01);
        break;
      case 5:
        RepeatedField<double>::~RepeatedField(this_01);
        break;
      case 6:
        RepeatedField<float>::~RepeatedField((RepeatedField<float> *)this_01);
        break;
      case 7:
        RepeatedField<bool>::~RepeatedField((RepeatedField<bool> *)this_01);
        break;
      case 9:
        RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)this_01);
        break;
      case 10:
        RepeatedPtrField<google::protobuf::Message>::~RepeatedPtrField
                  ((RepeatedPtrField<google::protobuf::Message> *)this_01);
      }
    }
    else if (iVar1 == 10) {
      pDVar4 = this->type_info_->prototype;
      if ((pDVar4 != (DynamicMessage *)0x0 && pDVar4 != this) &&
         (this_01->elements_ != (double *)0x0)) {
        (**(code **)((long)*this_01->elements_ + 8))();
      }
    }
    else if ((iVar1 == 9) &&
            (this_00 = (string *)this_01->elements_, this_00 != *(string **)(lVar3 + 0x44 + lVar6)))
    {
      if (this_00 != (string *)0x0) {
        std::__cxx11::string::~string(this_00);
      }
      operator_delete(this_00,0x20);
    }
    lVar6 = lVar6 + 0x78;
  }
  Message::~Message(&this->super_Message);
  return;
}

Assistant:

DynamicMessage::~DynamicMessage() {
  const Descriptor* descriptor = type_info_->type;

  reinterpret_cast<UnknownFieldSet*>(
    OffsetToPointer(type_info_->unknown_fields_offset))->~UnknownFieldSet();

  if (type_info_->extensions_offset != -1) {
    reinterpret_cast<ExtensionSet*>(
      OffsetToPointer(type_info_->extensions_offset))->~ExtensionSet();
  }

  // We need to manually run the destructors for repeated fields and strings,
  // just as we ran their constructors in the the DynamicMessage constructor.
  // Additionally, if any singular embedded messages have been allocated, we
  // need to delete them, UNLESS we are the prototype message of this type,
  // in which case any embedded messages are other prototypes and shouldn't
  // be touched.
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    void* field_ptr = OffsetToPointer(type_info_->offsets[i]);

    if (field->is_repeated()) {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                     \
        case FieldDescriptor::CPPTYPE_##UPPERCASE :                           \
          reinterpret_cast<RepeatedField<LOWERCASE>*>(field_ptr)              \
              ->~RepeatedField<LOWERCASE>();                                  \
          break

        HANDLE_TYPE( INT32,  int32);
        HANDLE_TYPE( INT64,  int64);
        HANDLE_TYPE(UINT32, uint32);
        HANDLE_TYPE(UINT64, uint64);
        HANDLE_TYPE(DOUBLE, double);
        HANDLE_TYPE( FLOAT,  float);
        HANDLE_TYPE(  BOOL,   bool);
        HANDLE_TYPE(  ENUM,    int);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING:
              reinterpret_cast<RepeatedPtrField<string>*>(field_ptr)
                  ->~RepeatedPtrField<string>();
              break;
          }
          break;

        case FieldDescriptor::CPPTYPE_MESSAGE:
          reinterpret_cast<RepeatedPtrField<Message>*>(field_ptr)
              ->~RepeatedPtrField<Message>();
          break;
      }

    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
      switch (field->options().ctype()) {
        default:  // TODO(kenton):  Support other string reps.
        case FieldOptions::STRING: {
          string* ptr = *reinterpret_cast<string**>(field_ptr);
          if (ptr != &field->default_value_string()) {
            delete ptr;
          }
          break;
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      if (!is_prototype()) {
        Message* message = *reinterpret_cast<Message**>(field_ptr);
        if (message != NULL) {
          delete message;
        }
      }
    }
  }
}